

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O1

void deqp::egl::logSurfaceAttribute(TestLog *log,EGLint attribute,EGLint value)

{
  char *__s;
  size_t sVar1;
  SurfaceAttribValueFmt valueFmt;
  SurfaceAttribValueFmt local_1a8;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  __s = eglu::getSurfaceAttribName(attribute);
  local_1a8.attribute = attribute;
  local_1a8.value = value;
  local_1a0 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"  ",2);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,": ",2);
  eglu::operator<<((ostream *)&local_198,&local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

static void logSurfaceAttribute (tcu::TestLog& log, EGLint attribute, EGLint value)
{
	const char*								name		= eglu::getSurfaceAttribName(attribute);
	const eglu::SurfaceAttribValueFmt		valueFmt	(attribute, value);

	log << TestLog::Message << "  " << name << ": " << valueFmt << TestLog::EndMessage;
}